

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrBindingModificationsKHR *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  XrBindingModificationBaseHeaderKHR *value_01;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  ulong uVar6;
  XrBindingModificationsKHR *in_stack_fffffffffffffa28;
  string bindingmodifications_prefix;
  string type_prefix;
  string bindingmodificationcount_prefix;
  string next_prefix;
  string local_538;
  string local_518;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string bindingmodifications_array_prefix;
  ostringstream oss_bindingModificationCount;
  ostringstream oss_bindingModifications_array;
  uint auStack_308 [88];
  ostringstream oss_bindingModifications;
  uint auStack_190 [88];
  
  PointerToHexString<XrBindingModificationsKHR>(in_stack_fffffffffffffa28);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_bindingModificationCount);
  std::__cxx11::string::~string((string *)&oss_bindingModificationCount);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_bindingModificationCount,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_bindingModificationCount);
    std::__cxx11::string::~string((string *)&oss_bindingModificationCount);
  }
  else {
    _oss_bindingModificationCount = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_bindingModificationCount);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_bindingModificationCount);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_538,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_538,contents);
  std::__cxx11::string::~string((string *)&local_538);
  if (bVar2) {
    std::__cxx11::string::string((string *)&bindingmodificationcount_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&bindingmodificationcount_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_bindingModificationCount);
    poVar4 = std::operator<<((ostream *)&oss_bindingModificationCount,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&bindingmodificationcount_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_bindingModifications_array);
    std::__cxx11::string::~string((string *)&oss_bindingModifications_array);
    std::__cxx11::string::string((string *)&bindingmodifications_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&bindingmodifications_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_bindingModifications_array);
    *(uint *)((long)auStack_308 + *(long *)(_oss_bindingModifications_array + -0x18)) =
         *(uint *)((long)auStack_308 + *(long *)(_oss_bindingModifications_array + -0x18)) &
         0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_bindingModifications_array);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[49],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [49])"const XrBindingModificationBaseHeaderKHR* const*",
               &bindingmodifications_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_bindingModifications);
    std::__cxx11::string::~string((string *)&oss_bindingModifications);
    uVar6 = 0;
    do {
      if (value->bindingModificationCount <= uVar6) {
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&oss_bindingModifications_array);
        std::__cxx11::string::~string((string *)&bindingmodifications_prefix);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_bindingModificationCount);
        std::__cxx11::string::~string((string *)&bindingmodificationcount_prefix);
        std::__cxx11::string::~string((string *)&next_prefix);
        std::__cxx11::string::~string((string *)&type_prefix);
        return true;
      }
      std::__cxx11::string::string
                ((string *)&bindingmodifications_array_prefix,(string *)&bindingmodifications_prefix
                );
      std::__cxx11::string::append((char *)&bindingmodifications_array_prefix);
      std::__cxx11::to_string((string *)&oss_bindingModifications,(uint)uVar6);
      std::__cxx11::string::append((string *)&bindingmodifications_array_prefix);
      std::__cxx11::string::~string((string *)&oss_bindingModifications);
      std::__cxx11::string::append((char *)&bindingmodifications_array_prefix);
      value_01 = value->bindingModifications[uVar6];
      if (value_01 == (XrBindingModificationBaseHeaderKHR *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_bindingModifications);
        *(uint *)((long)auStack_190 + *(long *)(_oss_bindingModifications + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(_oss_bindingModifications + -0x18)) &
             0xffffffb5 | 8;
        std::ostream::_M_insert<void_const*>((string *)&oss_bindingModifications);
        std::__cxx11::stringbuf::str();
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[49],std::__cxx11::string&,std::__cxx11::string>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)contents,(char (*) [49])"const XrBindingModificationBaseHeaderKHR* const*",
                   &bindingmodifications_array_prefix,&local_4d8);
        std::__cxx11::string::~string((string *)&local_4d8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_bindingModifications);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_4f8,(string *)&bindingmodifications_array_prefix);
        std::__cxx11::string::string
                  ((string *)&local_518,"const XrBindingModificationBaseHeaderKHR* const*",
                   (allocator *)&oss_bindingModifications);
        bVar2 = ApiDumpOutputXrStruct
                          (gen_dispatch_table,value_01,&local_4f8,&local_518,true,contents);
        std::__cxx11::string::~string((string *)&local_518);
        std::__cxx11::string::~string((string *)&local_4f8);
        if (!bVar2) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      std::__cxx11::string::~string((string *)&bindingmodifications_array_prefix);
      uVar6 = uVar6 + 1;
    } while( true );
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrBindingModificationsKHR* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string bindingmodificationcount_prefix = prefix;
        bindingmodificationcount_prefix += "bindingModificationCount";
        std::ostringstream oss_bindingModificationCount;
        oss_bindingModificationCount << "0x" << std::hex << (value->bindingModificationCount);
        contents.emplace_back("uint32_t", bindingmodificationcount_prefix, oss_bindingModificationCount.str());
        std::string bindingmodifications_prefix = prefix;
        bindingmodifications_prefix += "bindingModifications";
        std::ostringstream oss_bindingModifications_array;
        oss_bindingModifications_array << std::hex << reinterpret_cast<const void*>(value->bindingModifications);
        contents.emplace_back("const XrBindingModificationBaseHeaderKHR* const*", bindingmodifications_prefix, oss_bindingModifications_array.str());
        for (uint32_t value_bindingmodifications_inc = 0; value_bindingmodifications_inc < value->bindingModificationCount; ++value_bindingmodifications_inc) {
            std::string bindingmodifications_array_prefix = bindingmodifications_prefix;
            bindingmodifications_array_prefix += "[";
            bindingmodifications_array_prefix += std::to_string(value_bindingmodifications_inc);
            bindingmodifications_array_prefix += "]";
            if (nullptr == value->bindingModifications[value_bindingmodifications_inc]) {
                std::ostringstream oss_bindingModifications;
                oss_bindingModifications << std::hex << reinterpret_cast<const void*>(value->bindingModifications[value_bindingmodifications_inc]);
                contents.emplace_back("const XrBindingModificationBaseHeaderKHR* const*", bindingmodifications_array_prefix, oss_bindingModifications.str());
            } else if (!ApiDumpOutputXrStruct(gen_dispatch_table, value->bindingModifications[value_bindingmodifications_inc], bindingmodifications_array_prefix, "const XrBindingModificationBaseHeaderKHR* const*", true, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        return true;
    } catch(...) {
    }
    return false;
}